

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
unodb::detail::impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          node_ptr *node_in_parent)

{
  byte bVar1;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this;
  uint uVar2;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> _Var3;
  undefined4 extraout_var;
  basic_node_ptr<unodb::detail::node_header> bVar4;
  undefined8 uVar5;
  byte child_to_delete;
  bool bVar6;
  undefined1 auVar7 [16];
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar8;
  undefined1 local_50 [8];
  db_inode_unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte>_>_>
  current_node;
  
  auVar7[1] = key_byte;
  auVar7[0] = key_byte;
  auVar7[2] = key_byte;
  auVar7[3] = key_byte;
  auVar7[4] = key_byte;
  auVar7[5] = key_byte;
  auVar7[6] = key_byte;
  auVar7[7] = key_byte;
  auVar7[8] = key_byte;
  auVar7[9] = key_byte;
  auVar7[10] = key_byte;
  auVar7[0xb] = key_byte;
  auVar7[0xc] = key_byte;
  auVar7[0xd] = key_byte;
  auVar7[0xe] = key_byte;
  auVar7[0xf] = key_byte;
  auVar7 = vpcmpeqb_avx(auVar7,ZEXT416((uint)(inode->
                                             super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>
                                             ).keys));
  bVar1 = (inode->super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).field_0x8;
  _Var3._0_4_ = (uint)(ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) & ~(-1 << (bVar1 & 0x1f));
  _Var3._4_4_ = 0;
  uVar5 = 0;
  bVar6 = _Var3._0_4_ == 0;
  if (_Var3._0_4_ != 0) {
    uVar2 = 0;
    if (_Var3._0_4_ != 0) {
      for (; (_Var3._0_4_ >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
      }
    }
    this = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)
           (inode->super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).children.
           _M_elems[uVar2].value.tagged_ptr;
    uVar5 = 1;
    if (((ulong)this & 7) == 0) {
      current_node._M_t.
      super___uniq_ptr_impl<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
      .
      super__Head_base<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
      ._M_head_impl =
           (inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
           node_in_parent;
      _Var3._0_4_ = basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                              (this,(void *)k.field_0,(void *)k.field_0);
      _Var3._4_4_ = extraout_var;
      if (_Var3._0_4_ == 0) {
        child_to_delete = -bVar6 | (byte)uVar2;
        if (bVar1 == 2) {
          local_50 = (undefined1  [8])db_instance;
          current_node._M_t.
          super___uniq_ptr_impl<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          .
          super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          .
          super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          ._M_head_impl.db =
               (_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                )(_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                  )inode;
          bVar4 = basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::leave_last_child(&inode->
                                      super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>
                                     ,child_to_delete,db_instance);
          *(uintptr_t *)
           &(current_node._M_t.
             super___uniq_ptr_impl<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             .
             super__Head_base<0UL,_unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
            ._M_head_impl)->super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_> =
               bVar4.tagged_ptr;
          std::
          unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::~unique_ptr((unique_ptr<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)local_50);
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
          account_shrinking_inode<(unodb::node_type)1>(db_instance);
        }
        else {
          basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ::remove(&inode->super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>,
                   (char *)(ulong)child_to_delete);
        }
        _Var3._M_value = (basic_node_ptr<unodb::detail::node_header> *)0x0;
      }
      else {
        uVar5 = 0;
      }
    }
    else {
      _Var3._M_value =
           &(inode->super_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).children.
            _M_elems[uVar2].value;
    }
  }
  oVar8.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>._8_8_ =
       uVar5;
  oVar8.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_payload = (_Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>)
               (_Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true>)
               _Var3._M_value;
  return (optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>)
         oVar8.
         super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
         ._M_payload.
         super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>;
}

Assistant:

std::optional<detail::node_ptr*> impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    db<Key, Value>& db_instance, detail::node_ptr* node_in_parent) {
  const auto [child_i, child_ptr]{inode.find_child(key_byte)};

  if (child_ptr == nullptr) return {};

  const auto child_ptr_val{child_ptr->load()};
  if (child_ptr_val.type() != node_type::LEAF)
    return unwrap_fake_critical_section(child_ptr);

  const auto* const leaf{
      child_ptr_val.template ptr<typename db<Key, Value>::leaf_type*>()};
  if (!leaf->matches(k)) return {};

  if (UNODB_DETAIL_UNLIKELY(inode.is_min_size())) {
    if constexpr (std::is_same_v<INode, inode_4<Key, Value>>) {
      auto current_node{art_policy<Key, Value>::make_db_inode_unique_ptr(
          &inode, db_instance)};
      *node_in_parent = current_node->leave_last_child(child_i, db_instance);
    } else {
      auto new_node{
          INode::smaller_derived_type::create(db_instance, inode, child_i)};
      *node_in_parent =
          node_ptr{new_node.release(), INode::smaller_derived_type::type};
    }
#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS
    return nullptr;
  }

  inode.remove(child_i, db_instance);
  return nullptr;
}